

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

void __thiscall
llvm::DWARFUnit::getInlinedChainForAddress
          (DWARFUnit *this,uint64_t Address,SmallVectorImpl<llvm::DWARFDie> *InlinedChain)

{
  bool bVar1;
  Tag TVar2;
  DWARFUnit *local_50;
  undefined1 local_30 [8];
  DWARFDie SubroutineDIE;
  SmallVectorImpl<llvm::DWARFDie> *InlinedChain_local;
  uint64_t Address_local;
  DWARFUnit *this_local;
  
  SubroutineDIE.Die = (DWARFDebugInfoEntry *)InlinedChain;
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)InlinedChain);
  if (bVar1) {
    parseDWO(this);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->DWO);
    local_50 = this;
    if (bVar1) {
      local_50 = std::__shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->DWO);
    }
    _local_30 = getSubroutineForAddress(local_50,Address);
    bVar1 = DWARFDie::operator_cast_to_bool((DWARFDie *)local_30);
    if (bVar1) {
      while (bVar1 = DWARFDie::isSubprogramDIE((DWARFDie *)local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
        TVar2 = DWARFDie::getTag((DWARFDie *)local_30);
        if (TVar2 == DW_TAG_inlined_subroutine) {
          SmallVectorTemplateBase<llvm::DWARFDie,_true>::push_back
                    ((SmallVectorTemplateBase<llvm::DWARFDie,_true> *)SubroutineDIE.Die,
                     (DWARFDie *)local_30);
        }
        _local_30 = DWARFDie::getParent((DWARFDie *)local_30);
      }
      SmallVectorTemplateBase<llvm::DWARFDie,_true>::push_back
                ((SmallVectorTemplateBase<llvm::DWARFDie,_true> *)SubroutineDIE.Die,
                 (DWARFDie *)local_30);
    }
    return;
  }
  __assert_fail("InlinedChain.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                ,0x28a,
                "void llvm::DWARFUnit::getInlinedChainForAddress(uint64_t, SmallVectorImpl<DWARFDie> &)"
               );
}

Assistant:

void
DWARFUnit::getInlinedChainForAddress(uint64_t Address,
                                     SmallVectorImpl<DWARFDie> &InlinedChain) {
  assert(InlinedChain.empty());
  // Try to look for subprogram DIEs in the DWO file.
  parseDWO();
  // First, find the subroutine that contains the given address (the leaf
  // of inlined chain).
  DWARFDie SubroutineDIE =
      (DWO ? *DWO : *this).getSubroutineForAddress(Address);

  if (!SubroutineDIE)
    return;

  while (!SubroutineDIE.isSubprogramDIE()) {
    if (SubroutineDIE.getTag() == DW_TAG_inlined_subroutine)
      InlinedChain.push_back(SubroutineDIE);
    SubroutineDIE  = SubroutineDIE.getParent();
  }
  InlinedChain.push_back(SubroutineDIE);
}